

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O2

int __thiscall ON_PointCloud::RemoveRange(ON_PointCloud *this,int count,int *pIndices)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint i_00;
  double *pdVar7;
  bool *pbVar8;
  uint i;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint j;
  ON_SimpleArray<int> indices;
  ON_SimpleArray<int> local_48;
  
  iVar10 = 0;
  if (((pIndices != (int *)0x0) && (iVar10 = 0, 0 < count)) &&
     (uVar3 = (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count, uVar3 != 0)) {
    ON_SimpleArray<int>::ON_SimpleArray(&local_48,(ulong)(uint)count);
    ON_SimpleArray<int>::Append(&local_48,count,pIndices);
    ON_SimpleArray<int>::QuickSortAndRemoveDuplicates(&local_48,ON_CompareDecreasing<int>);
    if ((ulong)(uint)local_48.m_count == 0) {
      iVar10 = 0;
    }
    else {
      uVar11 = (this->m_N).m_count;
      uVar4 = (this->m_C).m_count;
      uVar5 = (this->m_V).m_count;
      uVar6 = (this->m_H).m_count;
      iVar10 = 0;
      j = uVar3;
      for (uVar9 = 0; (uint)local_48.m_count != uVar9; uVar9 = uVar9 + 1) {
        i_00 = local_48.m_a[uVar9];
        if (i_00 < uVar3) {
          j = j - 1;
          ON_SimpleArray<ON_3dPoint>::Swap(&(this->m_P).super_ON_SimpleArray<ON_3dPoint>,i_00,j);
          if (uVar3 == uVar11) {
            ON_SimpleArray<ON_3dVector>::Swap(&this->m_N,i_00,j);
          }
          if (uVar3 == uVar4) {
            ON_SimpleArray<ON_Color>::Swap(&this->m_C,i_00,j);
          }
          if ((uVar3 == uVar5) && (i_00 != j)) {
            pdVar7 = (this->m_V).m_a;
            dVar1 = pdVar7[(int)i_00];
            pdVar7[(int)i_00] = pdVar7[(int)j];
            pdVar7[(int)j] = dVar1;
          }
          if ((uVar3 == uVar6) && (i_00 != j)) {
            pbVar8 = (this->m_H).m_a;
            bVar2 = pbVar8[(int)i_00];
            pbVar8[(int)i_00] = pbVar8[(int)j];
            pbVar8[(int)j] = bVar2;
          }
          iVar10 = iVar10 + 1;
          if (j == 0) {
            j = 0;
            break;
          }
        }
      }
      if ((-1 < (int)j) && ((int)j <= (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_capacity)) {
        (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count = j;
      }
      ON_SimpleArray<ON_3dPoint>::Shrink(&(this->m_P).super_ON_SimpleArray<ON_3dPoint>);
      if (uVar3 == uVar11) {
        if ((-1 < (int)j) && ((int)j <= (this->m_N).m_capacity)) {
          (this->m_N).m_count = j;
        }
        ON_SimpleArray<ON_3dVector>::Shrink(&this->m_N);
      }
      if (uVar3 == uVar4) {
        if ((-1 < (int)j) && ((int)j <= (this->m_C).m_capacity)) {
          (this->m_C).m_count = j;
        }
        ON_SimpleArray<ON_Color>::Shrink(&this->m_C);
      }
      if (uVar3 == uVar5) {
        if ((-1 < (int)j) && ((int)j <= (this->m_V).m_capacity)) {
          (this->m_V).m_count = j;
        }
        ON_SimpleArray<double>::Shrink(&this->m_V);
      }
      if (uVar3 == uVar6) {
        if ((-1 < (int)j) && ((int)j <= (this->m_H).m_capacity)) {
          (this->m_H).m_count = j;
        }
        ON_SimpleArray<bool>::Shrink(&this->m_H);
        this->m_hidden_count = 0;
        uVar3 = (this->m_H).m_count;
        pbVar8 = (this->m_H).m_a;
        uVar11 = 0;
        for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
          if (pbVar8[uVar9] == true) {
            uVar11 = uVar11 + 1;
            this->m_hidden_count = uVar11;
          }
        }
        ON_BoundingBox::Destroy(&this->m_bbox);
      }
    }
    ON_SimpleArray<int>::~ON_SimpleArray(&local_48);
  }
  return iVar10;
}

Assistant:

int ON_PointCloud::RemoveRange(int count, const int* pIndices)
{
  const unsigned int point_count = m_P.UnsignedCount();
  if (0 == point_count || count <= 0 || nullptr == pIndices)
    return 0;

  ON_SimpleArray<int> indices(count);
  indices.Append(count, pIndices);
  indices.QuickSortAndRemoveDuplicates(ON_CompareDecreasing<int>);

  const unsigned int index_count = indices.Count();
  if (index_count <= 0)
    return 0;

  const bool bHaveNormals = point_count == m_N.UnsignedCount();
  const bool bHaveColors = point_count == m_C.UnsignedCount();
  const bool bHaveValues = point_count == m_V.UnsignedCount();
  const bool bHaveHidden = point_count == m_H.UnsignedCount();

  unsigned int points_removed = 0;
  unsigned int last_point_count = point_count;
  for (unsigned int i = 0; i < index_count; i++)
  {
    const unsigned int point_index = indices[i];
    if (point_index >= 0 && point_index < point_count)
    {
      m_P.Swap(point_index, last_point_count - 1);
      if (bHaveNormals)
        m_N.Swap(point_index, last_point_count - 1);
      if (bHaveColors)
        m_C.Swap(point_index, last_point_count - 1);
      if (bHaveValues)
        m_V.Swap(point_index, last_point_count - 1);
      if (bHaveHidden)
        m_H.Swap(point_index, last_point_count - 1);

      points_removed++;
      last_point_count--;
      if (last_point_count <= 0)
        break;
    }
  }

  m_P.SetCount(last_point_count);
  m_P.Shrink();
  if (bHaveNormals)
  {
    m_N.SetCount(last_point_count);
    m_N.Shrink();
  }
  if (bHaveColors)
  {
    m_C.SetCount(last_point_count);
    m_C.Shrink();
  }
  if (bHaveValues)
  {
    m_V.SetCount(last_point_count);
    m_V.Shrink();
  }
  if (bHaveHidden)
  {
    m_H.SetCount(last_point_count);
    m_H.Shrink();
    m_hidden_count = 0;
    for (unsigned int i = 0; i < m_H.UnsignedCount(); i++)
    {
      if (m_H[i])
        m_hidden_count++;
    }
    InvalidateBoundingBox();
  }

  return points_removed;
}